

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMath.cpp
# Opt level: O0

VRMatrix4 * __thiscall MinVR::VRMatrix4::transpose(VRMatrix4 *this)

{
  undefined8 in_RSI;
  VRMatrix4 *in_RDI;
  float unaff_retaddr;
  float unaff_retaddr_00;
  float in_stack_00000008;
  float in_stack_0000000c;
  float in_stack_00000020;
  float in_stack_00000028;
  float in_stack_00000030;
  float in_stack_00000038;
  float in_stack_00000040;
  float in_stack_00000050;
  float in_stack_00000058;
  
  fromRowMajorElements
            (in_stack_0000000c,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
             (float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0),(float)((ulong)in_RSI >> 0x20),
             (float)in_RSI,in_stack_00000020,in_stack_00000028,in_stack_00000030,in_stack_00000038,
             in_stack_00000040,this._0_4_,in_stack_00000050,in_stack_00000058);
  return in_RDI;
}

Assistant:

VRMatrix4 VRMatrix4::transpose() const {
    return VRMatrix4::fromRowMajorElements(m[0], m[1], m[2], m[3],
                                           m[4], m[5], m[6], m[7],
                                           m[8], m[9], m[10], m[11],
                                           m[12], m[13], m[14], m[15]);
}